

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

TValue * getgeneric(Table *t,TValue *key)

{
  undefined1 auVar1 [16];
  ushort uVar2;
  undefined8 uVar3;
  uint uVar4;
  TValue *pTVar5;
  long lVar6;
  ushort uVar7;
  char *__assertion;
  bool bVar8;
  undefined1 auVar9 [16];
  
  pTVar5 = &mainposition(t,key)->i_val;
  do {
    uVar2 = key->tt_;
    if (uVar2 == (((Node *)pTVar5)->i_key).nk.tt_) {
      uVar7 = uVar2 & 0x7f;
      switch(uVar7) {
      case 0:
        goto switchD_0012061a_caseD_0;
      case 1:
        if (uVar2 != 1) {
          __assert_fail("((((k1))->tt_) == (1))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x8c,"int equalkey(const TValue *, const Node *)");
        }
        bVar8 = (key->value_).b == *(int *)&((Node *)pTVar5)->i_key;
        goto LAB_00120671;
      case 2:
switchD_0012061a_caseD_2:
        if (uVar2 != 2) {
          __assert_fail("((((k1))->tt_) == (2))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x93,"int equalkey(const TValue *, const Node *)");
        }
        break;
      case 3:
        if (uVar2 != 3) {
          __assert_fail("((((k1))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                        ,0x90,"int equalkey(const TValue *, const Node *)");
        }
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (key->value_).i;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (((Node *)pTVar5)->i_key).nk.value_.i;
        uVar3 = vcmpsd_avx512f(auVar9,auVar1,0);
        uVar4 = (uint)uVar3 & 1;
        goto LAB_00120674;
      default:
        if (uVar7 == 0x13) {
          if (uVar2 != 0x13) {
            __assert_fail("((((k1))->tt_) == (((3) | ((1) << 4))))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                          ,0x8e,"int equalkey(const TValue *, const Node *)");
          }
        }
        else {
          if (uVar7 == 0x14) {
            if ((uVar2 & 0xf) != 4) {
              __assertion = "(((((((k1))->tt_)) & 0x0F)) == (4))";
LAB_0012078b:
              __assert_fail(__assertion,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                            ,0x97,"int equalkey(const TValue *, const Node *)");
            }
            if ((((TString *)(key->value_).gc)->tt & 0xf) != 4) {
              __assertion = "(((((k1)->value_).gc)->tt) & 0x0F) == 4";
              goto LAB_0012078b;
            }
            if (((*(TString **)&((Node *)pTVar5)->i_key)->tt & 0xf) != 4) {
              __assertion = "(((((n2)->i_key.nk.value_).gc)->tt) & 0x0F) == 4";
              goto LAB_0012078b;
            }
            uVar4 = luaS_eqlngstr((TString *)(key->value_).gc,*(TString **)&((Node *)pTVar5)->i_key)
            ;
            goto LAB_00120674;
          }
          if (uVar7 == 0x16) {
            if (uVar2 != 0x16) {
              __assert_fail("((((k1))->tt_) == (((6) | ((1) << 4))))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                            ,0x95,"int equalkey(const TValue *, const Node *)");
            }
          }
          else {
            if (uVar7 == 0x46) goto switchD_0012061a_caseD_2;
            if (-1 < (short)uVar2) {
              __assert_fail("(((k1)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltable.c"
                            ,0x99,"int equalkey(const TValue *, const Node *)");
            }
          }
        }
      }
      bVar8 = (key->value_).gc == (((Node *)pTVar5)->i_key).nk.value_.gc;
LAB_00120671:
      uVar4 = (uint)bVar8;
LAB_00120674:
      if (uVar4 != 0) {
        return &((Node *)pTVar5)->i_val;
      }
    }
    lVar6 = (long)(((Node *)pTVar5)->i_key).nk.next;
    pTVar5 = (TValue *)((long)pTVar5 + lVar6 * 0x20);
  } while (lVar6 != 0);
  pTVar5 = &luaO_nilobject_;
switchD_0012061a_caseD_0:
  return &((Node *)pTVar5)->i_val;
}

Assistant:

static const TValue *getgeneric (Table *t, const TValue *key) {
  Node *n = mainposition(t, key);
  for (;;) {  /* check whether 'key' is somewhere in the chain */
    if (equalkey(key, n))
      return gval(n);  /* that's it */
    else {
      int nx = gnext(n);
      if (nx == 0)
        return luaO_nilobject;  /* not found */
      n += nx;
    }
  }
}